

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

Index __thiscall
PlanningUnitMADPDiscrete::GetSuccessorJAHI(PlanningUnitMADPDiscrete *this,Index jahI,Index joI)

{
  bool bVar1;
  Index IVar2;
  Index IVar3;
  int iVar4;
  LIndex i;
  ulong uVar5;
  size_t sVar6;
  undefined8 uVar7;
  const_reference pvVar8;
  int in_EDX;
  int in_ESI;
  PlanningUnit *in_RDI;
  Index jahIsuc_wo;
  Index jahI_wo;
  Index t;
  undefined8 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  TreeNode<JointActionHistory> *in_stack_ffffffffffffffb0;
  PlanningUnitMADPDiscrete *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  Index local_4;
  
  IVar2 = (Index)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  bVar1 = PlanningUnitMADPDiscreteParameters::GetComputeJointActionHistories
                    ((PlanningUnitMADPDiscreteParameters *)((long)&in_RDI[1]._m_agentI + 1));
  if (bVar1) {
    GetJointActionHistoryTree
              ((PlanningUnitMADPDiscrete *)
               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),IVar2);
    TreeNode<JointActionHistory>::GetSuccessor
              ((TreeNode<JointActionHistory> *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    i = TreeNode<JointActionHistory>::GetIndex(in_stack_ffffffffffffffb0);
    local_4 = Globals::CastLIndexToIndex(i);
  }
  else {
    IVar2 = GetTimeStepForJAHI(in_stack_ffffffffffffffb8,
                               (Index)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
    uVar5 = (ulong)IVar2;
    sVar6 = PlanningUnit::GetHorizon(in_RDI);
    if (sVar6 - 1 <= uVar5) {
      uVar7 = __cxa_allocate_exception(0x28);
      E::E((E *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
           (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      __cxa_throw(uVar7,&E::typeinfo,E::~E);
    }
    pvVar8 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                       ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                        &in_RDI[7]._m_horizon,(ulong)IVar2);
    IVar3 = Globals::CastLIndexToIndex(*pvVar8);
    sVar6 = GetNrJointActions((PlanningUnitMADPDiscrete *)0x9dbd03);
    iVar4 = (in_ESI - IVar3) * (int)sVar6 + in_EDX;
    pvVar8 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                       ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                        &in_RDI[7]._m_horizon,(ulong)(IVar2 + 1));
    local_4 = Globals::CastLIndexToIndex(*pvVar8);
    local_4 = iVar4 + local_4;
  }
  return local_4;
}

Assistant:

Index PlanningUnitMADPDiscrete::GetSuccessorJAHI(Index jahI, Index joI) const
{
    if(_m_params.GetComputeJointActionHistories())
        return(CastLIndexToIndex(GetJointActionHistoryTree(jahI)->GetSuccessor(joI)->
                                 GetIndex()));

    Index t = GetTimeStepForJAHI(jahI);
    if(t >= GetHorizon() - 1)
        throw E("taking successor of last time step joint action history");
    //Index jahI Without Offset:
    Index jahI_wo = jahI - CastLIndexToIndex(_m_firstJAHIforT[t]);
    //jahI_wo   = |jo|^t * joI(0) +...+ |jo|^0 * joI(t)
    //jahIsuc_wo= |jo^|^(t+1) *joI(0) +...+ |jo|^1 * joI(t) + |jo|^0 * joI(t+1)
    //therefore the index of the successor (without offset) is:
    Index jahIsuc_wo = jahI_wo * GetNrJointActions() + joI;
    return(jahIsuc_wo + CastLIndexToIndex(_m_firstJAHIforT[t+1]));
}